

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChParserOpenSim::SetExcitationFunction
          (ChParserOpenSim *this,string *name,shared_ptr<chrono::ChFunction> *modulation)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  shared_ptr<chrono::ChLoadBase> force;
  undefined1 local_40 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  Report::GetForce((Report *)local_40,(string *)this);
  if ((__buckets_ptr)local_40._0_8_ != (__buckets_ptr)0x0) {
    lVar1 = __dynamic_cast(local_40._0_8_,&ChLoadBase::typeinfo,&ChLoadBodyForce::typeinfo,0);
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_;
    if (lVar1 == 0) {
      lVar1 = __dynamic_cast(local_40._0_8_,&ChLoadBase::typeinfo,&ChLoadBodyBodyTorque::typeinfo,0)
      ;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_;
      if (lVar1 == 0) goto LAB_009300b2;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_40._8_8_ + 8) = *(_Atomic_word *)(local_40._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_40._8_8_ + 8) = *(_Atomic_word *)(local_40._8_8_ + 8) + 1;
        }
      }
      local_40._16_8_ =
           (modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_40._24_8_ =
           (modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._24_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._24_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._24_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._24_8_)->_M_use_count + 1;
        }
      }
      *(undefined8 *)(lVar1 + 0x3b8) = local_40._16_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 0x3c0),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 0x18));
      this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._24_8_;
    }
    else {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_40._8_8_ + 8) = *(_Atomic_word *)(local_40._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_40._8_8_ + 8) = *(_Atomic_word *)(local_40._8_8_ + 8) + 1;
        }
      }
      local_40._32_8_ =
           (modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_18._M_pi =
           (modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
        }
      }
      *(undefined8 *)(lVar1 + 0x98) = local_40._32_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 0xa0),&local_18);
      this_01._M_pi = local_18._M_pi;
    }
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
LAB_009300b2:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
  }
  return;
}

Assistant:

void ChParserOpenSim::SetExcitationFunction(const std::string& name, std::shared_ptr<ChFunction> modulation) {
    // Get the force element from the report object
    auto force = m_report.GetForce(name);
    if (!force)
        return;

    if (auto b_force = std::dynamic_pointer_cast<ChLoadBodyForce>(force)) {
        b_force->SetModulationFunction(modulation);
    } else if (auto bb_torque = std::dynamic_pointer_cast<ChLoadBodyBodyTorque>(force)) {
        bb_torque->SetModulationFunction(modulation);
    }
}